

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

monster * choose_nearby_injured_kin(chunk *c,monster *mon)

{
  loc_conflict grid_00;
  uint32_t uVar1;
  monster *pmVar2;
  monster *kin;
  monster *found;
  wchar_t wStack_20;
  wchar_t nseen;
  loc_conflict grid;
  monster *mon_local;
  chunk *c_local;
  
  found._4_4_ = 0;
  kin = (monster *)0x0;
  for (nseen = (mon->grid).y + L'\xfffffffb'; nseen <= (mon->grid).y + L'\x05';
      nseen = nseen + L'\x01') {
    for (wStack_20 = (mon->grid).x + L'\xfffffffb'; wStack_20 <= (mon->grid).x + L'\x05';
        wStack_20 = wStack_20 + L'\x01') {
      grid_00.y = nseen;
      grid_00.x = wStack_20;
      pmVar2 = get_injured_kin(c,mon,grid_00);
      if (pmVar2 != (monster *)0x0) {
        found._4_4_ = found._4_4_ + 1;
        uVar1 = Rand_div(found._4_4_);
        if (uVar1 == 0) {
          kin = pmVar2;
        }
      }
    }
  }
  return kin;
}

Assistant:

struct monster *choose_nearby_injured_kin(struct chunk *c,
                                          const struct monster *mon)
{
	struct loc grid;
	int nseen = 0;
	struct monster *found = NULL;

	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			struct monster *kin = get_injured_kin(c, mon, grid);
			if (kin) {
				nseen++;
				if (!randint0(nseen))
					found = kin;
			}
		}
	}

	return found;
}